

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_setup(nk_draw_list *canvas,nk_convert_config *config,nk_buffer *cmds,
                       nk_buffer *vertices,nk_buffer *elements,nk_anti_aliasing line_aa,
                       nk_anti_aliasing shape_aa)

{
  nk_anti_aliasing line_aa_local;
  nk_buffer *elements_local;
  nk_buffer *vertices_local;
  nk_buffer *cmds_local;
  nk_convert_config *config_local;
  nk_draw_list *canvas_local;
  
  if (canvas == (nk_draw_list *)0x0) {
    __assert_fail("canvas",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x23bf,
                  "void nk_draw_list_setup(struct nk_draw_list *, const struct nk_convert_config *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, enum nk_anti_aliasing, enum nk_anti_aliasing)"
                 );
  }
  if (config == (nk_convert_config *)0x0) {
    __assert_fail("config",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x23c0,
                  "void nk_draw_list_setup(struct nk_draw_list *, const struct nk_convert_config *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, enum nk_anti_aliasing, enum nk_anti_aliasing)"
                 );
  }
  if (cmds == (nk_buffer *)0x0) {
    __assert_fail("cmds",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x23c1,
                  "void nk_draw_list_setup(struct nk_draw_list *, const struct nk_convert_config *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, enum nk_anti_aliasing, enum nk_anti_aliasing)"
                 );
  }
  if (vertices == (nk_buffer *)0x0) {
    __assert_fail("vertices",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x23c2,
                  "void nk_draw_list_setup(struct nk_draw_list *, const struct nk_convert_config *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, enum nk_anti_aliasing, enum nk_anti_aliasing)"
                 );
  }
  if (elements == (nk_buffer *)0x0) {
    __assert_fail("elements",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x23c3,
                  "void nk_draw_list_setup(struct nk_draw_list *, const struct nk_convert_config *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, enum nk_anti_aliasing, enum nk_anti_aliasing)"
                 );
  }
  if ((((canvas != (nk_draw_list *)0x0) && (config != (nk_convert_config *)0x0)) &&
      (cmds != (nk_buffer *)0x0)) &&
     ((vertices != (nk_buffer *)0x0 && (elements != (nk_buffer *)0x0)))) {
    canvas->buffer = cmds;
    memcpy(&canvas->config,config,0x40);
    canvas->elements = elements;
    canvas->vertices = vertices;
    canvas->line_AA = line_aa;
    canvas->shape_AA = shape_aa;
    (canvas->clip_rect).x = -8192.0;
    (canvas->clip_rect).y = -8192.0;
    (canvas->clip_rect).w = 16384.0;
    (canvas->clip_rect).h = 16384.0;
    canvas->cmd_offset = 0;
    canvas->element_count = 0;
    canvas->vertex_count = 0;
    canvas->cmd_offset = 0;
    canvas->cmd_count = 0;
    canvas->path_count = 0;
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_setup(struct nk_draw_list *canvas, const struct nk_convert_config *config,
    struct nk_buffer *cmds, struct nk_buffer *vertices, struct nk_buffer *elements,
    enum nk_anti_aliasing line_aa, enum nk_anti_aliasing shape_aa)
{
    NK_ASSERT(canvas);
    NK_ASSERT(config);
    NK_ASSERT(cmds);
    NK_ASSERT(vertices);
    NK_ASSERT(elements);
    if (!canvas || !config || !cmds || !vertices || !elements)
        return;

    canvas->buffer = cmds;
    canvas->config = *config;
    canvas->elements = elements;
    canvas->vertices = vertices;
    canvas->line_AA = line_aa;
    canvas->shape_AA = shape_aa;
    canvas->clip_rect = nk_null_rect;

    canvas->cmd_offset = 0;
    canvas->element_count = 0;
    canvas->vertex_count = 0;
    canvas->cmd_offset = 0;
    canvas->cmd_count = 0;
    canvas->path_count = 0;
}